

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Int ft_var_get_item_delta
                 (TT_Face face,GX_ItemVarStore itemStore,FT_UInt outerIndex,FT_UInt innerIndex)

{
  FT_UInt FVar1;
  GX_ItemVarData pGVar2;
  FT_Short *pFVar3;
  FT_Int32 FVar4;
  FT_Long FVar5;
  FT_Int32 local_70;
  FT_Fixed axisScalar;
  GX_AxisCoords axis;
  FT_UInt regionIndex;
  FT_Fixed scalar;
  FT_Fixed delta;
  FT_Fixed scaledDelta;
  FT_Fixed netAdjustment;
  FT_UInt j;
  FT_UInt master;
  FT_Short *deltaSet;
  GX_ItemVarData varData;
  FT_UInt innerIndex_local;
  FT_UInt outerIndex_local;
  GX_ItemVarStore itemStore_local;
  TT_Face face_local;
  
  scaledDelta = 0;
  pGVar2 = itemStore->varData;
  pFVar3 = pGVar2[outerIndex].deltaSet;
  FVar1 = pGVar2[outerIndex].regionIdxCount;
  for (netAdjustment._4_4_ = 0; netAdjustment._4_4_ < pGVar2[outerIndex].regionIdxCount;
      netAdjustment._4_4_ = netAdjustment._4_4_ + 1) {
    FVar4 = 0x10000;
    axisScalar = (FT_Fixed)
                 itemStore->varRegionList[pGVar2[outerIndex].regionIndices[netAdjustment._4_4_]].
                 axisList;
    for (netAdjustment._0_4_ = 0; (uint)netAdjustment < itemStore->axisCount;
        netAdjustment._0_4_ = (uint)netAdjustment + 1) {
      if ((*(long *)(axisScalar + 8) < *(long *)axisScalar) ||
         (*(long *)(axisScalar + 0x10) < *(long *)(axisScalar + 8))) {
        local_70 = 0x10000;
      }
      else if (((*(long *)axisScalar < 0) && (0 < *(long *)(axisScalar + 0x10))) &&
              (*(long *)(axisScalar + 8) != 0)) {
        local_70 = 0x10000;
      }
      else if (*(long *)(axisScalar + 8) == 0) {
        local_70 = 0x10000;
      }
      else if ((face->blend->normalizedcoords[(uint)netAdjustment] < *(long *)axisScalar) ||
              (*(long *)(axisScalar + 0x10) < face->blend->normalizedcoords[(uint)netAdjustment])) {
        local_70 = 0;
      }
      else if (face->blend->normalizedcoords[(uint)netAdjustment] == *(long *)(axisScalar + 8)) {
        local_70 = 0x10000;
      }
      else if (face->blend->normalizedcoords[(uint)netAdjustment] < *(long *)(axisScalar + 8)) {
        FVar5 = FT_DivFix(face->blend->normalizedcoords[(uint)netAdjustment] - *(long *)axisScalar,
                          *(long *)(axisScalar + 8) - *(long *)axisScalar);
        local_70 = (FT_Int32)FVar5;
      }
      else {
        FVar5 = FT_DivFix(*(long *)(axisScalar + 0x10) -
                          face->blend->normalizedcoords[(uint)netAdjustment],
                          *(long *)(axisScalar + 0x10) - *(long *)(axisScalar + 8));
        local_70 = (FT_Int32)FVar5;
      }
      FVar4 = FT_MulFix_x86_64(FVar4,local_70);
      axisScalar = axisScalar + 0x18;
    }
    FVar4 = FT_MulFix_x86_64(FVar4,(int)pFVar3[(ulong)(FVar1 * innerIndex) +
                                               (ulong)netAdjustment._4_4_] << 0x10);
    scaledDelta = scaledDelta + FVar4;
  }
  return (int)(short)((uint)((int)scaledDelta + 0x8000) >> 0x10);
}

Assistant:

static FT_Int
  ft_var_get_item_delta( TT_Face          face,
                         GX_ItemVarStore  itemStore,
                         FT_UInt          outerIndex,
                         FT_UInt          innerIndex )
  {
    GX_ItemVarData  varData;
    FT_Short*       deltaSet;

    FT_UInt   master, j;
    FT_Fixed  netAdjustment = 0;     /* accumulated adjustment */
    FT_Fixed  scaledDelta;
    FT_Fixed  delta;


    /* See pseudo code from `Font Variations Overview' */
    /* in the OpenType specification.                  */

    varData  = &itemStore->varData[outerIndex];
    deltaSet = &varData->deltaSet[varData->regionIdxCount * innerIndex];

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < varData->regionIdxCount; master++ )
    {
      FT_Fixed  scalar      = FT_FIXED_ONE;
      FT_UInt   regionIndex = varData->regionIndices[master];

      GX_AxisCoords  axis = itemStore->varRegionList[regionIndex].axisList;


      /* inner loop steps through axes in this region */
      for ( j = 0; j < itemStore->axisCount; j++, axis++ )
      {
        FT_Fixed  axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( face->blend->normalizedcoords[j] < axis->startCoord ||
                  face->blend->normalizedcoords[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( face->blend->normalizedcoords[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( face->blend->normalizedcoords[j] < axis->peakCoord )
            axisScalar =
              FT_DivFix( face->blend->normalizedcoords[j] - axis->startCoord,
                         axis->peakCoord - axis->startCoord );
          else
            axisScalar =
              FT_DivFix( axis->endCoord - face->blend->normalizedcoords[j],
                         axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        scalar = FT_MulFix( scalar, axisScalar );

      } /* per-axis loop */

      /* get the scaled delta for this region */
      delta       = FT_intToFixed( deltaSet[master] );
      scaledDelta = FT_MulFix( scalar, delta );

      /* accumulate the adjustments from each region */
      netAdjustment = netAdjustment + scaledDelta;

    } /* per-region loop */

    return FT_fixedToInt( netAdjustment );
  }